

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

bc_error_t * bc_error_new_printf(bc_error_type_t type,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  bc_error_t *local_48;
  bc_error_t *rv;
  char *tmp;
  va_list ap;
  char *format_local;
  bc_error_t *pbStack_10;
  bc_error_type_t type_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ap[0].reg_save_area = format;
  if (format == (char *)0x0) {
    pbStack_10 = bc_error_new(type,"");
  }
  else {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    tmp._4_4_ = 0x30;
    tmp._0_4_ = 0x10;
    rv = (bc_error_t *)bc_strdup_vprintf(format,(__va_list_tag *)&tmp);
    local_48 = bc_error_new(type,(char *)rv);
    free(rv);
    pbStack_10 = local_48;
  }
  return pbStack_10;
}

Assistant:

bc_error_t*
bc_error_new_printf(bc_error_type_t type, const char *format, ...)
{
    if (format == NULL)
        return bc_error_new(type, "");
    va_list ap;
    va_start(ap, format);
    char *tmp = bc_strdup_vprintf(format, ap);
    va_end(ap);
    bc_error_t *rv = bc_error_new(type, tmp);
    free(tmp);
    return rv;
}